

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Promise<void> __thiscall
kj::HttpServer::Connection::sendWebSocketError::BrokenWebSocket::disconnect(BrokenWebSocket *this)

{
  PromiseNode *extraout_RDX;
  long in_RSI;
  Promise<void> PVar1;
  Exception local_170;
  BrokenWebSocket *this_local;
  
  this_local = this;
  cp<kj::Exception>(&local_170,(Exception *)(in_RSI + 8));
  Promise<void>::Promise((Promise<void> *)this,&local_170);
  Exception::~Exception(&local_170);
  PVar1.super_PromiseBase.node.ptr = extraout_RDX;
  PVar1.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar1.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> disconnect() override {
        return kj::cp(exception);
      }